

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDCheckAndAssertIfTTDRunning(char *msg)

{
  bool bVar1;
  JsrtContext *this;
  ScriptContext *this_00;
  JsrtContext *context;
  char *msg_local;
  
  this = JsrtContext::GetCurrent();
  if (this != (JsrtContext *)0x0) {
    this_00 = JsrtContext::GetScriptContext(this);
    bVar1 = Js::ScriptContext::ShouldPerformRecordAction(this_00);
    if (bVar1) {
      TTDAbort_unrecoverable_error(msg);
    }
  }
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDCheckAndAssertIfTTDRunning(_In_ const char* msg)
{
#if ENABLE_TTD
    JsrtContext* context = JsrtContext::GetCurrent();
    TTDAssert(context == nullptr || !context->GetScriptContext()->ShouldPerformRecordAction(), msg);
#endif
    return JsNoError;
}